

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O1

void __thiscall
crnlib::crn_comp::optimize_color_endpoints_task(crn_comp *this,uint64 data,void *pData_ptr)

{
  uint8 *puVar1;
  int *piVar2;
  float fVar3;
  uint8 uVar4;
  ushort uVar5;
  ushort uVar6;
  vector<unsigned_short> *remapping;
  long lVar7;
  level_details *plVar8;
  endpoint_indices_details *peVar9;
  unsigned_short *puVar10;
  undefined8 uVar11;
  bool bVar12;
  long lVar13;
  uint16 i;
  unsigned_short uVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  byte bVar18;
  uint16 i_1;
  int iVar19;
  uint min_new_capacity;
  byte bVar20;
  ulong uVar21;
  vector<unsigned_char> *packed_data;
  byte bVar22;
  byte *pbVar23;
  ulong uVar24;
  int iVar25;
  byte bVar26;
  uint uVar27;
  ulong uVar28;
  uint uVar29;
  uint uVar30;
  uint8 uVar31;
  int iVar32;
  ulong uVar33;
  crn_comp *this_00;
  uint uVar34;
  bool bVar35;
  static_huffman_data_model dm;
  vector<unsigned_int> hist;
  symbol_codec codec;
  byte local_1b7;
  byte local_1b6;
  byte local_1b5;
  byte local_1b4;
  byte local_1b3;
  ushort local_1b2;
  byte local_1af;
  byte local_1ae;
  byte local_1ad;
  byte local_1ac;
  byte local_1ab;
  byte local_1aa;
  ulong local_190;
  ulong local_180;
  void *local_148;
  unsigned_short *puStack_140;
  uchar *local_130;
  uint local_128;
  elemental_vector local_108;
  crn_comp *local_f0;
  long local_e8;
  uint8 *local_e0;
  unsigned_short *local_d8;
  ulong local_d0;
  symbol_codec local_c8;
  
  remapping = *(vector<unsigned_short> **)((long)pData_ptr + 0x18);
  uVar5 = *(ushort *)((long)pData_ptr + 0x10);
  uVar16 = (ulong)uVar5;
  uVar15 = remapping->m_size;
  if (uVar15 != uVar5) {
    if (uVar15 <= uVar5) {
      uVar27 = (uint)uVar5;
      if (remapping->m_capacity < uVar27) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)remapping,uVar27,uVar15 + 1 == uVar27,2,(object_mover)0x0,
                   false);
      }
      memset(remapping->m_p + remapping->m_size,0,(ulong)(uVar27 - remapping->m_size) * 2);
    }
    remapping->m_size = (uint)uVar5;
  }
  local_f0 = this;
  if (data == 0) {
    lVar7 = *pData_ptr;
    uVar15 = remapping->m_size;
    uVar27 = (uint)uVar5;
    if (uVar15 != uVar27) {
      if (uVar15 <= uVar27) {
        if (remapping->m_capacity < uVar27) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)remapping,uVar27,uVar15 + 1 == uVar27,2,(object_mover)0x0,
                     false);
        }
        memset(remapping->m_p + remapping->m_size,0,(ulong)(uVar27 - remapping->m_size) * 2);
      }
      remapping->m_size = uVar27;
    }
    local_c8.m_pDecode_buf = (uint8 *)0x0;
    local_c8.m_pDecode_buf_next = (uint8 *)0x0;
    if (uVar16 == 0) {
      local_148 = (void *)0x0;
      puStack_140 = (unsigned_short *)0x0;
    }
    else {
      elemental_vector::increase_capacity
                ((elemental_vector *)&local_c8,(uint)uVar5,uVar27 == 1,8,
                 vector<crnlib::optimize_color_params::unpacked_endpoint>::object_mover,false);
      local_c8.m_pDecode_buf_next = (uint8 *)CONCAT44(local_c8.m_pDecode_buf_next._4_4_,(uint)uVar5)
      ;
      local_148 = (void *)0x0;
      puStack_140 = (unsigned_short *)0x0;
      uVar15 = (uint)uVar5;
      elemental_vector::increase_capacity
                ((elemental_vector *)&local_148,uVar15,uVar27 == 1,2,(object_mover)0x0,false);
      memset((void *)(((ulong)puStack_140 & 0xffffffff) * 2 + (long)local_148),0,
             (ulong)(uVar15 - (uint)puStack_140) * 2);
      puStack_140 = (unsigned_short *)CONCAT44(puStack_140._4_4_,uVar15);
      uVar17 = 0;
      do {
        local_c8.m_pDecode_buf[uVar17 * 8] = *(uint8 *)(lVar7 + uVar17 * 8);
        local_c8.m_pDecode_buf[uVar17 * 8 + 1] = *(uint8 *)(lVar7 + 1 + uVar17 * 8);
        local_c8.m_pDecode_buf[uVar17 * 8 + 2] = *(uint8 *)(lVar7 + 2 + uVar17 * 8);
        local_c8.m_pDecode_buf[uVar17 * 8 + 3] = *(uint8 *)(lVar7 + 3 + uVar17 * 8);
        local_c8.m_pDecode_buf[uVar17 * 8 + 4] = *(uint8 *)(lVar7 + 4 + uVar17 * 8);
        local_c8.m_pDecode_buf[uVar17 * 8 + 5] = *(uint8 *)(lVar7 + 5 + uVar17 * 8);
        local_c8.m_pDecode_buf[uVar17 * 8 + 6] = *(uint8 *)(lVar7 + 6 + uVar17 * 8);
        local_c8.m_pDecode_buf[uVar17 * 8 + 7] = *(uint8 *)(lVar7 + 7 + uVar17 * 8);
        *(short *)((long)local_148 + uVar17 * 2) = (short)uVar17;
        uVar17 = uVar17 + 1;
      } while (uVar16 != uVar17);
      bVar18 = 0;
      bVar20 = 0;
      bVar22 = 0;
      uVar15 = 0;
      uVar27 = 0;
      bVar26 = 0;
      uVar17 = uVar16;
      do {
        uVar30 = 0xffffffff;
        uVar24 = 0;
        uVar29 = 0;
        do {
          uVar34 = ((uint)local_c8.m_pDecode_buf[uVar24 * 8 + 6] - (uint)bVar26) *
                   ((uint)local_c8.m_pDecode_buf[uVar24 * 8 + 6] - (uint)bVar26) +
                   (local_c8.m_pDecode_buf[uVar24 * 8 + 5] - uVar27) *
                   (local_c8.m_pDecode_buf[uVar24 * 8 + 5] - uVar27) +
                   (local_c8.m_pDecode_buf[uVar24 * 8 + 4] - uVar15) *
                   (local_c8.m_pDecode_buf[uVar24 * 8 + 4] - uVar15) +
                   ((uint)local_c8.m_pDecode_buf[uVar24 * 8 + 2] - (uint)bVar22) *
                   ((uint)local_c8.m_pDecode_buf[uVar24 * 8 + 2] - (uint)bVar22) +
                   ((uint)local_c8.m_pDecode_buf[uVar24 * 8 + 1] - (uint)bVar20) *
                   ((uint)local_c8.m_pDecode_buf[uVar24 * 8 + 1] - (uint)bVar20) +
                   ((uint)local_c8.m_pDecode_buf[uVar24 * 8] - (uint)bVar18) *
                   ((uint)local_c8.m_pDecode_buf[uVar24 * 8] - (uint)bVar18);
          if (uVar34 < uVar30) {
            uVar30 = uVar34;
            uVar29 = (uint)uVar24;
          }
          uVar24 = uVar24 + 1;
        } while (uVar24 < uVar17);
        uVar33 = (ulong)(uVar29 & 0xffff);
        bVar18 = local_c8.m_pDecode_buf[uVar33 * 8];
        bVar20 = local_c8.m_pDecode_buf[uVar33 * 8 + 1];
        bVar22 = local_c8.m_pDecode_buf[uVar33 * 8 + 2];
        uVar15 = (uint)local_c8.m_pDecode_buf[uVar33 * 8 + 4];
        uVar27 = (uint)local_c8.m_pDecode_buf[uVar33 * 8 + 5];
        bVar26 = local_c8.m_pDecode_buf[uVar33 * 8 + 6];
        uVar24 = (ulong)((uVar29 & 0xffff) * 2);
        remapping->m_p[*(ushort *)((long)local_148 + uVar24)] = uVar5 - (short)uVar17;
        local_c8.m_pDecode_buf[uVar33 * 8] = local_c8.m_pDecode_buf[uVar17 * 8 + -8];
        local_c8.m_pDecode_buf[uVar33 * 8 + 1] = local_c8.m_pDecode_buf[uVar17 * 8 + -7];
        local_c8.m_pDecode_buf[uVar33 * 8 + 2] = local_c8.m_pDecode_buf[uVar17 * 8 + -6];
        local_c8.m_pDecode_buf[uVar33 * 8 + 3] = local_c8.m_pDecode_buf[uVar17 * 8 + -5];
        local_c8.m_pDecode_buf[uVar33 * 8 + 4] = local_c8.m_pDecode_buf[uVar17 * 8 + -4];
        local_c8.m_pDecode_buf[uVar33 * 8 + 5] = local_c8.m_pDecode_buf[uVar17 * 8 + -3];
        local_c8.m_pDecode_buf[uVar33 * 8 + 6] = local_c8.m_pDecode_buf[uVar17 * 8 + -2];
        local_c8.m_pDecode_buf[uVar33 * 8 + 7] = local_c8.m_pDecode_buf[uVar17 * 8 + -1];
        *(undefined2 *)((long)local_148 + uVar24) =
             *(undefined2 *)((long)local_148 + uVar17 * 2 + -2);
        uVar17 = uVar17 - 1;
      } while (uVar17 != 0);
    }
    if (local_148 != (void *)0x0) {
      crnlib_free(local_148);
    }
    this_00 = local_f0;
    if (local_c8.m_pDecode_buf != (uint8 *)0x0) {
      crnlib_free(local_c8.m_pDecode_buf);
    }
    optimize_color_selectors(this_00);
  }
  else {
    local_d8 = remapping->m_p;
    lVar7 = *pData_ptr;
    local_e8 = *(long *)((long)pData_ptr + 8);
    local_1b2 = *(ushort *)((long)pData_ptr + 0x12);
    fVar3 = *(float *)((long)pData_ptr + 0x14);
    local_c8.m_pDecode_buf = (uint8 *)0x0;
    local_c8.m_pDecode_buf_next = (uint8 *)0x0;
    uVar27 = (uint)uVar5;
    uVar15 = (uint)uVar5;
    if (uVar16 != 0) {
      elemental_vector::increase_capacity
                ((elemental_vector *)&local_c8,uVar15,uVar15 == 1,0x18,vector<Node>::object_mover,
                 false);
      if (uVar27 != (uint)local_c8.m_pDecode_buf_next) {
        memset(local_c8.m_pDecode_buf + ((ulong)local_c8.m_pDecode_buf_next & 0xffffffff) * 0x18,0,
               (((ulong)(uVar15 - (uint)local_c8.m_pDecode_buf_next) * 0x18 - 0x18) / 0x18) * 0x18 +
               0x18);
      }
      local_c8.m_pDecode_buf_next = (uint8 *)CONCAT44(local_c8.m_pDecode_buf_next._4_4_,uVar27);
      lVar13 = 0x17;
      uVar17 = 0;
      do {
        *(int *)(local_c8.m_pDecode_buf + lVar13 + -0x17) = (int)uVar17;
        local_c8.m_pDecode_buf[lVar13 + -7] = *(uint8 *)(lVar7 + uVar17 * 8);
        local_c8.m_pDecode_buf[lVar13 + -6] = *(uint8 *)(lVar7 + 1 + uVar17 * 8);
        local_c8.m_pDecode_buf[lVar13 + -5] = *(uint8 *)(lVar7 + 2 + uVar17 * 8);
        local_c8.m_pDecode_buf[lVar13 + -4] = *(uint8 *)(lVar7 + 3 + uVar17 * 8);
        local_c8.m_pDecode_buf[lVar13 + -3] = *(uint8 *)(lVar7 + 4 + uVar17 * 8);
        local_c8.m_pDecode_buf[lVar13 + -2] = *(uint8 *)(lVar7 + 5 + uVar17 * 8);
        local_c8.m_pDecode_buf[lVar13 + -1] = *(uint8 *)(lVar7 + 6 + uVar17 * 8);
        local_c8.m_pDecode_buf[lVar13] = *(uint8 *)(lVar7 + 7 + uVar17 * 8);
        uVar17 = uVar17 + 1;
        lVar13 = lVar13 + 0x18;
      } while (uVar16 != uVar17);
    }
    local_148 = (void *)0x0;
    puStack_140 = (unsigned_short *)0x0;
    if (uVar16 != 0) {
      min_new_capacity = uVar15 * 2;
      elemental_vector::increase_capacity
                ((elemental_vector *)&local_148,min_new_capacity,false,2,(object_mover)0x0,false);
      memset((void *)(((ulong)puStack_140 & 0xffffffff) * 2 + (long)local_148),0,
             (ulong)(min_new_capacity - (uint)puStack_140) * 2);
      puStack_140 = (unsigned_short *)CONCAT44(puStack_140._4_4_,min_new_capacity);
    }
    this_00 = local_f0;
    uVar17 = (ulong)local_1b2;
    *(ushort *)((long)local_148 + uVar16 * 2) = local_1b2;
    bVar18 = local_c8.m_pDecode_buf[uVar17 * 0x18 + 0x10];
    local_1b3 = local_c8.m_pDecode_buf[uVar17 * 0x18 + 0x11];
    local_1b4 = local_c8.m_pDecode_buf[uVar17 * 0x18 + 0x12];
    local_1b5 = local_c8.m_pDecode_buf[uVar17 * 0x18 + 0x14];
    local_1b6 = local_c8.m_pDecode_buf[uVar17 * 0x18 + 0x15];
    local_1b7 = local_c8.m_pDecode_buf[uVar17 * 0x18 + 0x16];
    local_180 = (ulong)(uVar27 - 1);
    uVar11 = *(undefined8 *)(local_c8.m_pDecode_buf + local_180 * 0x18 + 8);
    *(undefined8 *)(local_c8.m_pDecode_buf + uVar17 * 0x18) =
         *(undefined8 *)(local_c8.m_pDecode_buf + local_180 * 0x18);
    *(undefined8 *)(local_c8.m_pDecode_buf + uVar17 * 0x18 + 8) = uVar11;
    local_c8.m_pDecode_buf[uVar17 * 0x18 + 0x10] = local_c8.m_pDecode_buf[local_180 * 0x18 + 0x10];
    local_c8.m_pDecode_buf[uVar17 * 0x18 + 0x11] = local_c8.m_pDecode_buf[local_180 * 0x18 + 0x11];
    local_c8.m_pDecode_buf[uVar17 * 0x18 + 0x12] = local_c8.m_pDecode_buf[local_180 * 0x18 + 0x12];
    local_c8.m_pDecode_buf[uVar17 * 0x18 + 0x13] = local_c8.m_pDecode_buf[local_180 * 0x18 + 0x13];
    local_c8.m_pDecode_buf[uVar17 * 0x18 + 0x14] = local_c8.m_pDecode_buf[local_180 * 0x18 + 0x14];
    local_c8.m_pDecode_buf[uVar17 * 0x18 + 0x15] = local_c8.m_pDecode_buf[local_180 * 0x18 + 0x15];
    local_c8.m_pDecode_buf[uVar17 * 0x18 + 0x16] = local_c8.m_pDecode_buf[local_180 * 0x18 + 0x16];
    local_c8.m_pDecode_buf[uVar17 * 0x18 + 0x17] = local_c8.m_pDecode_buf[local_180 * 0x18 + 0x17];
    uVar17 = uVar16;
    local_190 = uVar16;
    if (uVar27 - 1 != 0) {
      uVar24 = (ulong)(local_1b2 * uVar27);
      bVar35 = true;
      iVar19 = 0;
      bVar12 = true;
      local_1af = local_1b7;
      local_1ae = local_1b6;
      local_1ad = local_1b5;
      local_1ac = local_1b4;
      local_1ab = local_1b3;
      local_1aa = bVar18;
      do {
        local_d0 = uVar17;
        local_e0 = local_c8.m_pDecode_buf;
        pbVar23 = local_c8.m_pDecode_buf + 0x16;
        uVar33 = 0;
        uVar17 = 0;
        uVar15 = 0;
        do {
          uVar27 = *(uint *)(pbVar23 + -0x16);
          iVar25 = *(int *)(pbVar23 + -0x12) + *(int *)(local_e8 + uVar24 * 4 + (ulong)uVar27 * 4);
          *(int *)(pbVar23 + -0x12) = iVar25;
          iVar32 = (int)(long)((fVar3 + 1.0) * 4000.0);
          if (bVar12) {
            uVar29 = ((uint)*pbVar23 - (uint)local_1af) * ((uint)*pbVar23 - (uint)local_1af) +
                     ((uint)pbVar23[-1] - (uint)local_1ae) * ((uint)pbVar23[-1] - (uint)local_1ae) +
                     ((uint)pbVar23[-2] - (uint)local_1ad) * ((uint)pbVar23[-2] - (uint)local_1ad) +
                     ((uint)pbVar23[-4] - (uint)local_1ac) * ((uint)pbVar23[-4] - (uint)local_1ac) +
                     ((uint)pbVar23[-5] - (uint)local_1ab) * ((uint)pbVar23[-5] - (uint)local_1ab) +
                     ((uint)pbVar23[-6] - (uint)local_1aa) * ((uint)pbVar23[-6] - (uint)local_1aa);
            if (3999 < uVar29) {
              uVar29 = 4000;
            }
            *(uint *)(pbVar23 + -0xe) = iVar32 - uVar29;
          }
          if (bVar35) {
            uVar29 = ((uint)*pbVar23 - (uint)local_1b7) * ((uint)*pbVar23 - (uint)local_1b7) +
                     ((uint)pbVar23[-1] - (uint)local_1b6) * ((uint)pbVar23[-1] - (uint)local_1b6) +
                     ((uint)pbVar23[-2] - (uint)local_1b5) * ((uint)pbVar23[-2] - (uint)local_1b5) +
                     ((uint)pbVar23[-4] - (uint)local_1b4) * ((uint)pbVar23[-4] - (uint)local_1b4) +
                     ((uint)pbVar23[-5] - (uint)local_1b3) * ((uint)pbVar23[-5] - (uint)local_1b3) +
                     ((uint)pbVar23[-6] - (uint)bVar18) * ((uint)pbVar23[-6] - (uint)bVar18);
            if (3999 < uVar29) {
              uVar29 = 4000;
            }
            *(uint *)(pbVar23 + -10) = iVar32 - uVar29;
          }
          uVar29 = *(uint *)(pbVar23 + -10);
          if (*(uint *)(pbVar23 + -10) < *(uint *)(pbVar23 + -0xe)) {
            uVar29 = *(uint *)(pbVar23 + -0xe);
          }
          uVar29 = (iVar25 + iVar19) * uVar29 + 1;
          if ((uVar15 < uVar29) || ((uVar15 == uVar29 && (uVar27 < local_1b2)))) {
            uVar17 = uVar33 & 0xffffffff;
            local_1b2 = (ushort)uVar27;
            uVar15 = uVar29;
          }
          uVar33 = uVar33 + 1;
          pbVar23 = pbVar23 + 0x18;
        } while (local_180 != uVar33);
        uVar24 = (ulong)((uint)local_1b2 * (uint)uVar5);
        iVar25 = (int)local_d0;
        iVar32 = (int)local_190;
        if (iVar25 - iVar32 == 0 || iVar25 < iVar32) {
          uVar21 = 0;
          uVar33 = 0;
        }
        else {
          lVar7 = local_e8 + uVar24 * 4;
          uVar15 = 0;
          uVar21 = 0;
          uVar33 = local_d0;
          uVar28 = local_190;
          iVar19 = iVar25 - iVar32;
          do {
            uVar21 = (ulong)(uint)((int)uVar21 +
                                  *(int *)(lVar7 + (ulong)*(ushort *)((long)local_148 + uVar28 * 2)
                                                   * 4) * iVar19);
            uVar15 = uVar15 + *(int *)(lVar7 + (ulong)*(ushort *)((long)local_148 + uVar33 * 2) * 4)
                              * iVar19;
            uVar28 = (ulong)((int)uVar28 + 1);
            uVar33 = (ulong)((int)uVar33 - 1);
            bVar35 = 2 < iVar19;
            iVar19 = iVar19 + -2;
          } while (bVar35);
          uVar33 = (ulong)uVar15;
        }
        puVar1 = local_c8.m_pDecode_buf + uVar17 * 0x18;
        iVar19 = *(int *)(puVar1 + 4);
        uVar21 = *(uint *)(puVar1 + 8) * uVar21;
        uVar33 = *(uint *)(puVar1 + 0xc) * uVar33;
        bVar35 = uVar21 - uVar33 == 0;
        bVar12 = uVar21 >= uVar33 && !bVar35;
        if (uVar21 < uVar33 || bVar35) {
          uVar17 = (ulong)(iVar25 + 1);
          *(ushort *)((long)local_148 + uVar17 * 2) = local_1b2;
          bVar18 = puVar1[0x10];
          local_1b3 = puVar1[0x11];
          local_1b4 = puVar1[0x12];
          local_1b5 = puVar1[0x14];
          local_1b6 = puVar1[0x15];
          local_1b7 = puVar1[0x16];
        }
        else {
          local_190 = (ulong)(iVar32 - 1);
          *(ushort *)((long)local_148 + local_190 * 2) = local_1b2;
          local_1aa = puVar1[0x10];
          local_1ab = puVar1[0x11];
          local_1ac = puVar1[0x12];
          local_1ad = puVar1[0x14];
          local_1ae = puVar1[0x15];
          local_1af = puVar1[0x16];
          uVar17 = local_d0;
        }
        iVar19 = iVar19 << 3;
        bVar35 = uVar21 < uVar33 || uVar21 - uVar33 == 0;
        local_180 = local_180 - 1;
        uVar11 = *(undefined8 *)(local_c8.m_pDecode_buf + local_180 * 0x18 + 8);
        *(undefined8 *)puVar1 = *(undefined8 *)(local_c8.m_pDecode_buf + local_180 * 0x18);
        *(undefined8 *)(puVar1 + 8) = uVar11;
        puVar1[0x10] = local_c8.m_pDecode_buf[local_180 * 0x18 + 0x10];
        puVar1[0x11] = local_c8.m_pDecode_buf[local_180 * 0x18 + 0x11];
        puVar1[0x12] = local_c8.m_pDecode_buf[local_180 * 0x18 + 0x12];
        puVar1[0x13] = local_c8.m_pDecode_buf[local_180 * 0x18 + 0x13];
        puVar1[0x14] = local_c8.m_pDecode_buf[local_180 * 0x18 + 0x14];
        puVar1[0x15] = local_c8.m_pDecode_buf[local_180 * 0x18 + 0x15];
        puVar1[0x16] = local_c8.m_pDecode_buf[local_180 * 0x18 + 0x16];
        puVar1[0x17] = local_c8.m_pDecode_buf[local_180 * 0x18 + 0x17];
      } while (local_180 != 0);
    }
    if (((uint)local_190 & 0xffff) <= (uint)uVar17) {
      uVar14 = 0;
      do {
        local_d8[*(ushort *)((long)local_148 + (local_190 & 0xffff) * 2)] = uVar14;
        uVar15 = (int)local_190 + 1;
        local_190 = (ulong)uVar15;
        uVar14 = uVar14 + 1;
      } while ((uVar15 & 0xffff) <= (uint)uVar17);
    }
    if (local_148 != (void *)0x0) {
      crnlib_free(local_148);
    }
    if (local_c8.m_pDecode_buf != (uint8 *)0x0) {
      crnlib_free(local_c8.m_pDecode_buf);
    }
  }
  packed_data = (vector<unsigned_char> *)(*(long *)((long)pData_ptr + 0x18) + 0x10);
  if (this_00->m_has_etc_color_blocks == true) {
    pack_color_endpoints_etc(this_00,packed_data,remapping);
  }
  else {
    pack_color_endpoints(this_00,packed_data,remapping);
  }
  iVar19 = *(int *)(*(long *)((long)pData_ptr + 0x18) + 0x18);
  local_108.m_p = (void *)0x0;
  local_108.m_size = 0;
  local_108.m_capacity = 0;
  if (uVar16 != 0) {
    elemental_vector::increase_capacity(&local_108,(uint)uVar5,uVar5 == 1,4,(object_mover)0x0,false)
    ;
    memset((void *)((local_108._8_8_ & 0xffffffff) * 4 + (long)local_108.m_p),0,
           (ulong)(uVar5 - local_108.m_size) << 2);
    local_108.m_size = (uint)uVar5;
  }
  if ((this_00->m_levels).m_size != 0) {
    plVar8 = (this_00->m_levels).m_p;
    peVar9 = (this_00->m_endpoint_indices).m_p;
    bVar35 = this_00->m_has_subblocks;
    uVar17 = 0;
    do {
      uVar15 = plVar8[uVar17].first_block;
      uVar24 = (ulong)uVar15;
      uVar27 = plVar8[uVar17].num_blocks + uVar15;
      if (uVar15 < uVar27) {
        puVar10 = remapping->m_p;
        uVar15 = 0;
        do {
          uVar6 = puVar10[peVar9[uVar24].field_0.field_0.color];
          uVar4 = peVar9[uVar24].reference;
          uVar31 = uVar4;
          if ((bVar35 & 1U) == 0) {
            uVar31 = uVar4 == '\0';
          }
          if ((uVar24 & 1) == 0) {
            uVar31 = uVar4 == '\0';
          }
          if (uVar31 != '\0') {
            iVar32 = uVar6 - uVar15;
            piVar2 = (int *)((long)local_108.m_p +
                            (ulong)((iVar32 >> 0x1f & (uint)uVar5) + iVar32) * 4);
            *piVar2 = *piVar2 + 1;
          }
          uVar24 = uVar24 + 1;
          uVar15 = (uint)uVar6;
        } while (uVar27 != uVar24);
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 < (this_00->m_levels).m_size);
  }
  static_huffman_data_model::static_huffman_data_model((static_huffman_data_model *)&local_148);
  static_huffman_data_model::init((static_huffman_data_model *)&local_148,(EVP_PKEY_CTX *)0x1);
  if (local_128 == 0) {
    local_130 = (uchar *)0x0;
  }
  iVar19 = iVar19 << 3;
  if (uVar16 != 0) {
    uVar17 = 0;
    do {
      iVar19 = iVar19 + (uint)local_130[uVar17] * *(int *)((long)local_108.m_p + uVar17 * 4);
      uVar17 = uVar17 + 1;
    } while (uVar16 != uVar17);
  }
  symbol_codec::symbol_codec(&local_c8);
  symbol_codec::start_encoding(&local_c8,0x10000);
  local_c8.m_simulate_encoding = true;
  symbol_codec::encode_transmit_static_huffman_data_model
            (&local_c8,(static_huffman_data_model *)&local_148,false,
             (static_huffman_data_model *)0x0);
  symbol_codec::stop_encoding(&local_c8,false);
  *(uint *)(*(long *)((long)pData_ptr + 0x18) + 0x20) = iVar19 + local_c8.m_total_bits_written;
  if (pData_ptr != (void *)0x0) {
    crnlib_free(pData_ptr);
  }
  if (local_c8.m_output_syms.m_p != (output_symbol *)0x0) {
    crnlib_free(local_c8.m_output_syms.m_p);
  }
  if (local_c8.m_arith_output_buf.m_p != (uchar *)0x0) {
    crnlib_free(local_c8.m_arith_output_buf.m_p);
  }
  if (local_c8.m_output_buf.m_p != (uchar *)0x0) {
    crnlib_free(local_c8.m_output_buf.m_p);
  }
  static_huffman_data_model::~static_huffman_data_model((static_huffman_data_model *)&local_148);
  if (local_108.m_p != (void *)0x0) {
    crnlib_free(local_108.m_p);
  }
  return;
}

Assistant:

void crn_comp::optimize_color_endpoints_task(uint64 data, void* pData_ptr)
    {
        optimize_color_params* pParams = reinterpret_cast<optimize_color_params*>(pData_ptr);
        crnlib::vector<uint16>& remapping = pParams->pResult->endpoint_remapping;
        uint16 n = pParams->n;
        remapping.resize(n);

        if (data)
        {
            remap_color_endpoints(remapping.get_ptr(), pParams->unpacked_endpoints, pParams->hist, n, pParams->selected, pParams->weight);
        }
        else
        {
            sort_color_endpoints(remapping, pParams->unpacked_endpoints, n);
            optimize_color_selectors();
        }

        m_has_etc_color_blocks ? pack_color_endpoints_etc(pParams->pResult->packed_endpoints, remapping) : pack_color_endpoints(pParams->pResult->packed_endpoints, remapping);
        uint total_bits = pParams->pResult->packed_endpoints.size() << 3;

        crnlib::vector<uint> hist(n);
        for (uint level = 0; level < m_levels.size(); level++)
        {
            for (uint endpoint_index = 0, b = m_levels[level].first_block, bEnd = b + m_levels[level].num_blocks; b < bEnd; b++)
            {
                uint index = remapping[m_endpoint_indices[b].component[cColor]];
                if (m_has_subblocks && b & 1 ? m_endpoint_indices[b].reference : !m_endpoint_indices[b].reference)
                {
                    int sym = index - endpoint_index;
                    hist[sym < 0 ? sym + n : sym]++;
                }
                endpoint_index = index;
            }
        }

        static_huffman_data_model dm;
        dm.init(true, n, hist.get_ptr(), 16);
        const uint8* code_sizes = dm.get_code_sizes();
        for (uint16 s = 0; s < n; s++)
        {
            total_bits += hist[s] * code_sizes[s];
        }

        symbol_codec codec;
        codec.start_encoding(64 * 1024);
        codec.encode_enable_simulation(true);
        codec.encode_transmit_static_huffman_data_model(dm, false);
        codec.stop_encoding(false);
        total_bits += codec.encode_get_total_bits_written();

        pParams->pResult->total_bits = total_bits;

        crnlib_delete(pParams);
    }